

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

NumericExpr * __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
::ReadNumericExpr_abi_cxx11_
          (NumericExpr *__return_storage_ptr__,
          NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
          *this,char code,bool ignore_zero)

{
  int iVar1;
  undefined7 in_register_00000011;
  int iVar2;
  bool bVar3;
  Expr local_40;
  
  iVar2 = (int)CONCAT71(in_register_00000011,code);
  switch(iVar2) {
  case 0x6c:
  case 0x6e:
  case 0x73:
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
    ::ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                    *)this,code);
    break;
  case 0x6f:
    iVar2 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
            ::ReadOpCode((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                          *)this);
    ReadNumericExpr_abi_cxx11_(__return_storage_ptr__,this,iVar2);
    return __return_storage_ptr__;
  case 0x76:
    DoReadReference_abi_cxx11_(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  default:
    if (iVar2 == 0x66) {
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
      ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                  *)this,*(uint *)(*(long *)(this + 8) + 0x60));
      iVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                        (*(BinaryReader<mp::internal::EndiannessConverter> **)this);
      iVar2 = 0;
      if (0 < iVar1) {
        iVar2 = iVar1;
      }
      while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
        ReadSymbolicExpr_abi_cxx11_(&local_40,this);
        std::__cxx11::string::~string((string *)&local_40);
      }
      break;
    }
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
    BinaryReaderBase::ReportError<>(*(BinaryReaderBase **)this,(CStringRef)0x12cec2);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}